

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O0

Roaring * __thiscall doublechecked::Roaring::operator^=(Roaring *this,Roaring *r)

{
  bool bVar1;
  reference puVar2;
  reference puVar3;
  Roaring *in_RDI;
  iterator r_it_end;
  iterator r_it;
  iterator it_end;
  iterator it;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff50;
  uint in_stack_ffffffffffffff54;
  const_iterator in_stack_ffffffffffffff58;
  _Rb_tree_const_iterator<unsigned_int> __first;
  undefined4 in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  uint uVar4;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 uVar5;
  _Self local_30;
  _Self local_28;
  _Self local_20;
  _Self local_18 [3];
  
  roaring::Roaring::operator^=
            ((Roaring *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (Roaring *)in_stack_ffffffffffffff48);
  local_18[0]._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 (in_stack_ffffffffffffff48);
  local_20._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                 (in_stack_ffffffffffffff48);
  local_28._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 (in_stack_ffffffffffffff48);
  local_30._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                 (in_stack_ffffffffffffff48);
  bVar1 = std::operator==(local_18,&local_20);
  if (bVar1) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::operator=
              ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
               in_stack_ffffffffffffff48);
  }
  else {
    bVar1 = std::operator==(&local_28,&local_30);
    if (!bVar1) {
      puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                         ((_Rb_tree_const_iterator<unsigned_int> *)0x1123c6);
      uVar4 = *puVar2;
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::rbegin
                (in_stack_ffffffffffffff48);
      puVar3 = std::reverse_iterator<std::_Rb_tree_const_iterator<unsigned_int>_>::operator*
                         ((reverse_iterator<std::_Rb_tree_const_iterator<unsigned_int>_> *)
                          CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      uVar5 = CONCAT13(1,(int3)in_stack_ffffffffffffff74);
      if (uVar4 <= *puVar3) {
        puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                           ((_Rb_tree_const_iterator<unsigned_int> *)0x112410);
        in_stack_ffffffffffffff6c = *puVar2;
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::rbegin
                  (in_stack_ffffffffffffff48);
        puVar3 = std::reverse_iterator<std::_Rb_tree_const_iterator<unsigned_int>_>::operator*
                           ((reverse_iterator<std::_Rb_tree_const_iterator<unsigned_int>_> *)
                            CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
        uVar5 = CONCAT13(*puVar3 < in_stack_ffffffffffffff6c,(int3)uVar5);
      }
      if ((char)((uint)uVar5 >> 0x18) == '\0') {
        while (bVar1 = std::operator!=(&local_28,&local_30), bVar1) {
          bVar1 = std::operator==(local_18,&local_20);
          if (bVar1) {
            in_stack_ffffffffffffff58._M_node = (_Base_ptr)&in_RDI->check;
            std::_Rb_tree_const_iterator<unsigned_int>::operator*
                      ((_Rb_tree_const_iterator<unsigned_int> *)0x1124f6);
            std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                      ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       CONCAT44(uVar5,uVar4),
                       (value_type_conflict *)
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
            std::_Rb_tree_const_iterator<unsigned_int>::operator++
                      ((_Rb_tree_const_iterator<unsigned_int> *)
                       CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
          }
          else {
            puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                               ((_Rb_tree_const_iterator<unsigned_int> *)0x11252b);
            in_stack_ffffffffffffff54 = *puVar2;
            puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                               ((_Rb_tree_const_iterator<unsigned_int> *)0x11253e);
            if (in_stack_ffffffffffffff54 == *puVar2) {
              local_18[0]._M_node =
                   (_Base_ptr)
                   std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
                   erase_abi_cxx11_((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                                     *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50)
                                    ,in_stack_ffffffffffffff58);
              std::_Rb_tree_const_iterator<unsigned_int>::operator++
                        ((_Rb_tree_const_iterator<unsigned_int> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
            }
            else {
              puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                                 ((_Rb_tree_const_iterator<unsigned_int> *)0x112597);
              in_stack_ffffffffffffff50 = *puVar2;
              puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                                 ((_Rb_tree_const_iterator<unsigned_int> *)0x1125aa);
              if (in_stack_ffffffffffffff50 < *puVar2) {
                std::_Rb_tree_const_iterator<unsigned_int>::operator++
                          ((_Rb_tree_const_iterator<unsigned_int> *)
                           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
              }
              else {
                std::_Rb_tree_const_iterator<unsigned_int>::operator*
                          ((_Rb_tree_const_iterator<unsigned_int> *)0x1125de);
                std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                insert((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                       CONCAT44(uVar5,uVar4),
                       (value_type_conflict *)
                       CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
                std::_Rb_tree_const_iterator<unsigned_int>::operator++
                          ((_Rb_tree_const_iterator<unsigned_int> *)
                           CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
              }
            }
          }
        }
      }
      else {
        __first._M_node = (_Base_ptr)&in_RDI->check;
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                  (in_stack_ffffffffffffff48);
        std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                  (in_stack_ffffffffffffff48);
        std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
        insert<std::_Rb_tree_const_iterator<unsigned_int>>
                  ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),__first,
                   (_Rb_tree_const_iterator<unsigned_int>)in_stack_ffffffffffffff58._M_node);
      }
    }
  }
  return in_RDI;
}

Assistant:

Roaring &operator^=(const Roaring &r) {
        plain ^= r.plain;

        auto it = check.begin();
        auto it_end = check.end();
        auto r_it = r.check.begin();
        auto r_it_end = r.check.end();
        if (it == it_end) {
            check = r.check;
        }  // this empty
        else if (r_it == r_it_end) {
        }  // r empty
        else if (*it > *r.check.rbegin() || *r_it > *check.rbegin()) {
            check.insert(r.check.begin(), r.check.end());  // obvious disjoint
        } else
            while (r_it != r_it_end) {  // may overlap
                if (it == it_end) {
                    check.insert(*r_it);
                    ++r_it;
                } else if (*it == *r_it) {  // remove overlapping value
                    it = check.erase(it);   // returns *following* iterator
                    ++r_it;
                } else if (*it < *r_it) {
                    ++it;
                }  // keep value from this
                else {
                    check.insert(*r_it);
                    ++r_it;
                }  // add value from r
            }

        return *this;
    }